

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O2

void * Bac_ManInsertAbc(Bac_Man_t *p,void *pAbc)

{
  Bac_Man_t *pNew;
  
  pNew = Bac_ManDupUserBoxes(p);
  Bac_ManMarkNodesAbc(p,(Abc_Ntk_t *)pAbc);
  Bac_ManRemapBarbufs(pNew,p);
  Bac_NtkInsertNtk(pNew,(Abc_Ntk_t *)pAbc);
  Bac_ManMoveNames(pNew,p);
  return pNew;
}

Assistant:

void * Bac_ManInsertAbc( Bac_Man_t * p, void * pAbc )
{
    Abc_Ntk_t * pNtk = (Abc_Ntk_t *)pAbc;
    Bac_Man_t * pNew = Bac_ManDupUserBoxes( p );
    Bac_ManMarkNodesAbc( p, pNtk );
    Bac_ManRemapBarbufs( pNew, p );
    Bac_NtkInsertNtk( pNew, pNtk );
    Bac_ManMoveNames( pNew, p );
    return pNew;
}